

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableProxyObjectWalker::Get
          (RecyclableProxyObjectWalker *this,int i,ResolvedObject *pResolvedObject)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  anon_union_8_2_815e7e51_for_DynamicObject_2 aVar7;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar8;
  RecyclableObjectAddress *this_00;
  GlobalObject *_parentObj;
  TrackAllocData local_70;
  JavascriptProxy *local_48;
  JavascriptProxy *proxy;
  ResolvedObject *pResolvedObject_local;
  RecyclableProxyObjectWalker *pRStack_30;
  int i_local;
  RecyclableProxyObjectWalker *this_local;
  RecyclableObject *local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  proxy = (JavascriptProxy *)pResolvedObject;
  pResolvedObject_local._4_4_ = i;
  pRStack_30 = this;
  local_48 = VarTo<Js::JavascriptProxy>((this->super_RecyclableObjectWalker).instance);
  pRVar5 = Js::JavascriptProxy::GetTarget(local_48);
  if ((pRVar5 != (RecyclableObject *)0x0) &&
     (pRVar5 = Js::JavascriptProxy::GetHandler(local_48), pRVar5 != (RecyclableObject *)0x0)) {
    if (pResolvedObject_local._4_4_ == 0) {
      proxy[1].super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)L"[target]";
      pRVar5 = Js::JavascriptProxy::GetTarget(local_48);
      (proxy->handler).ptr = pRVar5;
    }
    else {
      if (pResolvedObject_local._4_4_ != 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0xebc,"(false)","false");
        if (bVar3) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          return 0;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      proxy[1].super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)L"[handler]";
      pRVar5 = Js::JavascriptProxy::GetHandler(local_48);
      (proxy->handler).ptr = pRVar5;
    }
    *(undefined4 *)
     &(proxy->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0xffffffff;
    (proxy->super_DynamicObject).super_RecyclableObject.type.ptr =
         (Type *)(this->super_RecyclableObjectWalker).scriptContext;
    local_20 = (proxy->handler).ptr;
    if (local_20 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = TaggedInt::Is(local_20);
    if (bVar3) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
      if (bVar3) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) && (BVar4 = RecyclableObject::IsExternal(pRStack_10), BVar4 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = local_14;
      }
    }
    *(TypeId *)&proxy[1].super_DynamicObject.super_RecyclableObject.type.ptr = local_18;
    aVar7 = (anon_union_8_2_815e7e51_for_DynamicObject_2)
            ResolvedObject::CreateDisplay((ResolvedObject *)proxy);
    (proxy->super_DynamicObject).field_1 = aVar7;
    plVar1 = *(long **)&(proxy->super_DynamicObject).field_1.field_1;
    (**(code **)(*plVar1 + 0x30))(plVar1,0x820);
    pAVar8 = &GetArenaFromContext((ScriptContext *)
                                  (proxy->super_DynamicObject).super_RecyclableObject.type.ptr)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xeca);
    pAVar8 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar8,&local_70);
    this_00 = (RecyclableObjectAddress *)
              new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar8,0x3f67b0);
    _parentObj = ScriptContextBase::GetGlobalObject
                           ((ScriptContextBase *)
                            &((proxy->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             javascriptLibrary);
    RecyclableObjectAddress::RecyclableObjectAddress
              (this_00,_parentObj,0x126,(proxy->handler).ptr,0);
    (proxy->super_DynamicObject).auxSlots.ptr = (WriteBarrierPtr<void> *)this_00;
    return 1;
  }
  return 0;
}

Assistant:

BOOL RecyclableProxyObjectWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(instance);
        if (proxy->GetTarget() == nullptr || proxy->GetHandler() == nullptr)
        {
            return FALSE;
        }
        if (i == 0)
        {
            pResolvedObject->name = _u("[target]");
            pResolvedObject->obj = proxy->GetTarget();
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("[handler]");
            pResolvedObject->obj = proxy->GetHandler();
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = Anew(GetArenaFromContext(pResolvedObject->scriptContext),
            RecyclableObjectAddress,
            pResolvedObject->scriptContext->GetGlobalObject(),
            Js::PropertyIds::Proxy,
            pResolvedObject->obj,
            false /*isInDeadZone*/);

        return TRUE;
    }